

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

bool __thiscall
SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::Next
          (EditingIterator *this)

{
  code *pcVar1;
  SListNodeBase<Memory::Recycler> SVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type TVar5;
  SListNodeBase<Memory::Recycler> local_30;
  
  if (this->last == (NodeBase *)0x0) {
    TVar5.ptr = (this->super_Iterator).current;
  }
  else {
    SListNodeBase<Memory::Recycler>::Next(&local_30);
    TVar5.ptr = (this->super_Iterator).current;
    if (local_30.next.ptr != (Type)TVar5.ptr) {
      TVar5.ptr = this->last;
      (this->super_Iterator).current = TVar5.ptr;
      goto LAB_006db844;
    }
  }
  this->last = TVar5.ptr;
LAB_006db844:
  if ((SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)TVar5.ptr ==
      (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  TVar5.ptr = &((this->super_Iterator).list)->super_SListNodeBase<Memory::Recycler>;
  SListNodeBase<Memory::Recycler>::Next(&local_30);
  SVar2.next.ptr = local_30.next.ptr;
  if (local_30.next.ptr == (Type)TVar5.ptr) {
    local_30.next.ptr = (Type)(SListNodeBase<Memory::Recycler> *)0x0;
  }
  else {
    SListNodeBase<Memory::Recycler>::Next(&local_30);
  }
  (this->super_Iterator).current = (NodeBase *)local_30.next.ptr;
  return SVar2.next.ptr != (Type)TVar5.ptr;
}

Assistant:

bool Next()
        {
            if (last != nullptr && last->Next() != this->current)
            {
                this->current = last;
            }
            else
            {
                last = this->current;
            }
            return Iterator::Next();
        }